

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<char_const(&)[38],std::__cxx11::string&>
                   (string *__return_storage_ptr__,char (*a) [38],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_d0;
  cmAlphaNum local_98;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_60;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_48;
  iterator local_30;
  undefined8 local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b_local;
  char (*a_local) [38];
  
  local_20 = b;
  b_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)a;
  a_local = (char (*) [38])__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_98,*a);
  cmStrCat<char_const(&)[38],std::__cxx11::string&>(char_const(&)[38],std::__cxx11::string&)::
  {lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&local_60,
             &cmStrCat<char_const(&)[38],std::__cxx11::string&>(char_const&[],std::__cxx11::string&)
              ::makePair,&local_98);
  cmAlphaNum::cmAlphaNum(&local_d0,local_20);
  cmStrCat<char_const(&)[38],std::__cxx11::string&>(char_const(&)[38],std::__cxx11::string&)::
  {lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_48,
             &cmStrCat<char_const(&)[38],std::__cxx11::string&>(char_const&[],std::__cxx11::string&)
              ::makePair,&local_d0);
  local_30 = &local_60;
  local_28 = 2;
  views._M_len = 2;
  views._M_array = local_30;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}